

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_tree_nodes.h
# Opt level: O1

void __thiscall
st_tree::detail::
node_base<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>,_std::multiset<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*,_st_tree::detail::ptr_less_data<std::less<str1>_>,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>_>_>
::~node_base(node_base<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>,_std::multiset<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*,_st_tree::detail::ptr_less_data<std::less<str1>_>,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>_>_>
             *this)

{
  _Rb_tree_header *p_Var1;
  node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>
  *pnVar2;
  pointer puVar3;
  pointer pcVar4;
  ulong uVar5;
  _Link_type p_Var6;
  _Base_ptr p_Var7;
  _Link_type p_Var8;
  ulong uVar9;
  allocator_type *__a;
  _Link_type in_RSI;
  size_t __n;
  _Link_type p_Var10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  _Link_type local_50;
  
  this->_vptr_node_base = (_func_int **)&PTR__node_base_003113d8;
  if (((this->_children)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) &&
     (this->_tree != (tree_type *)0x0 || this->_parent != (node_type *)0x0)) {
    p_Var7 = (this->_children)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->_children)._M_t._M_impl.super__Rb_tree_header;
    p_Var10 = (_Link_type)0x0;
    p_Var8 = (_Link_type)0x0;
    if ((_Rb_tree_header *)p_Var7 == p_Var1) {
      local_50 = (_Link_type)0x0;
    }
    else {
      local_50 = (_Link_type)0x0;
      do {
        pnVar2 = *(node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>
                   **)(p_Var7 + 1);
        if (p_Var10 == p_Var8) {
          __n = (long)p_Var10 - (long)local_50;
          if (__n == 0x7ffffffffffffff8) {
            std::__throw_length_error("vector::_M_realloc_insert");
          }
          uVar9 = (long)__n >> 3;
          uVar5 = 1;
          if (p_Var10 != local_50) {
            uVar5 = uVar9;
          }
          __a = (allocator_type *)(uVar5 + uVar9);
          if ((allocator_type *)0xffffffffffffffe < __a) {
            __a = (allocator_type *)0xfffffffffffffff;
          }
          if (CARRY8(uVar5,uVar9)) {
            __a = (allocator_type *)0xfffffffffffffff;
          }
          if (__a == (allocator_type *)0x0) {
            p_Var6 = (_Link_type)0x0;
          }
          else {
            p_Var6 = (_Link_type)
                     std::
                     allocator_traits<std::allocator<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>_>
                     ::allocate(__a,(size_type)in_RSI);
          }
          *(node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>
            **)(&p_Var6->_M_storage)[uVar9 - 4]._M_storage = pnVar2;
          if (0 < (long)__n) {
            memmove(p_Var6,local_50,__n);
          }
          in_RSI = p_Var8;
          if (local_50 != (_Link_type)0x0) {
            in_RSI = (_Link_type)((long)p_Var8 - (long)local_50);
            operator_delete(local_50,(ulong)in_RSI);
          }
          p_Var10 = (_Link_type)(__n + (long)p_Var6);
          p_Var8 = (_Link_type)(&p_Var6->_M_storage + (long)(__a + -4));
          local_50 = p_Var6;
        }
        else {
          *(node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>
            **)&p_Var10->super__Rb_tree_node_base = pnVar2;
        }
        p_Var10 = (_Link_type)&(p_Var10->super__Rb_tree_node_base)._M_parent;
        p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
      } while ((_Rb_tree_header *)p_Var7 != p_Var1);
    }
    std::
    _Rb_tree<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*,_st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*,_std::_Identity<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>,_st_tree::detail::ptr_less_data<std::less<str1>_>,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>_>
    ::_M_erase((_Rb_tree<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*,_st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*,_std::_Identity<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>,_st_tree::detail::ptr_less_data<std::less<str1>_>,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>_>
                *)(this->_children)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,in_RSI);
    (this->_children)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    (this->_children)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    (this->_children)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    (this->_children)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    tree(this);
    for (p_Var6 = local_50; p_Var6 != p_Var10;
        p_Var6 = (_Link_type)&(p_Var6->super__Rb_tree_node_base)._M_parent) {
      pnVar2 = *(node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>
                 **)&p_Var6->super__Rb_tree_node_base;
      (**(pnVar2->
         super_node_base<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>,_std::multiset<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*,_st_tree::detail::ptr_less_data<std::less<str1>_>,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>_>_>
         )._vptr_node_base)(pnVar2);
      in_RSI = (_Link_type)0xa8;
      operator_delete(pnVar2,0xa8);
    }
    if (local_50 != (_Link_type)0x0) {
      in_RSI = (_Link_type)((long)p_Var8 - (long)local_50);
      operator_delete(local_50,(ulong)in_RSI);
    }
  }
  (this->_depth)._vptr_max_maintainer = (_func_int **)&PTR__max_maintainer_00311428;
  puVar3 = (this->_depth)._hist.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar3 != (pointer)0x0) {
    in_RSI = (_Link_type)
             ((long)(this->_depth)._hist.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage - (long)puVar3);
    operator_delete(puVar3,(ulong)in_RSI);
  }
  std::
  _Rb_tree<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*,_st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*,_std::_Identity<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>,_st_tree::detail::ptr_less_data<std::less<str1>_>,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>_>
  ::_M_erase((_Rb_tree<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*,_st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*,_std::_Identity<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>,_st_tree::detail::ptr_less_data<std::less<str1>_>,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>_>
              *)(this->_children)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,in_RSI);
  pcVar4 = (this->_data).s1._M_dataplus._M_p;
  paVar11 = &(this->_data).s1.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar11) {
    operator_delete(pcVar4,paVar11->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

virtual ~node_base() {
        // Saves work, and also prevents exception attempting to call tree() on default-constructed nodes
        if (_children.empty() || _default_constructed()) return;
        // Save off child pointers, take down the child container, and then deallocate children
        vector<node_type*> d;
        for (iterator j(begin());  j != end();  ++j)  d.push_back(&*j);
        _children.clear();
        tree_type& tree_ = this->tree();
        for (typename vector<node_type*>::iterator e(d.begin());  e != d.end();  ++e)  tree_._delete_node(*e);
    }